

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O3

void __thiscall
proto2_unittest::TestMutualRecursionA_SubMessage::~TestMutualRecursionA_SubMessage
          (TestMutualRecursionA_SubMessage *this)

{
  InternalMetadata *this_00;
  TestMutualRecursionB *this_01;
  ulong uVar1;
  LogMessageFatal local_20;
  
  uVar1 = (this->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
    google::protobuf::internal::InternalMetadata::
    DeleteOutOfLineHelper<google::protobuf::UnknownFieldSet>(this_00);
    uVar1 = this_00->ptr_;
  }
  if ((uVar1 & 1) != 0) {
    uVar1 = *(ulong *)(uVar1 & 0xfffffffffffffffe);
  }
  if (uVar1 == 0) {
    this_01 = (this->field_0)._impl_.b_;
    if (this_01 != (TestMutualRecursionB *)0x0) {
      TestMutualRecursionB::~TestMutualRecursionB(this_01);
    }
    operator_delete(this_01,0x28);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O3/google/protobuf/unittest.pb.cc"
             ,0x5700,"this_.GetArena() == nullptr");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

TestMutualRecursionA_SubMessage::~TestMutualRecursionA_SubMessage() {
  // @@protoc_insertion_point(destructor:proto2_unittest.TestMutualRecursionA.SubMessage)
  SharedDtor(*this);
}